

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_uncommited_seeks(void)

{
  fdb_status fVar1;
  fdb_config *pfVar2;
  int iVar3;
  int delete_opt;
  char *pcVar4;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_iterator *pfStack_7a0;
  fdb_kvs_handle *pfStack_798;
  fdb_file_handle *pfStack_790;
  fdb_doc *pfStack_788;
  fdb_kvs_config fStack_780;
  timeval tStack_768;
  fdb_config fStack_758;
  fdb_config *pfStack_660;
  fdb_iterator *pfStack_648;
  fdb_kvs_handle *pfStack_640;
  fdb_doc *pfStack_638;
  fdb_file_handle *pfStack_630;
  fdb_kvs_config fStack_628;
  timeval tStack_610;
  fdb_config fStack_600;
  fdb_config *pfStack_508;
  fdb_iterator *pfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  fdb_file_handle *pfStack_4e0;
  fdb_doc *pfStack_4d8;
  uint64_t uStack_4d0;
  undefined1 uStack_4c8;
  undefined7 uStack_4c0;
  undefined4 uStack_4b9;
  undefined8 uStack_4b0;
  undefined7 uStack_4a8;
  undefined4 uStack_4a1;
  fdb_kvs_config fStack_498;
  timeval tStack_480;
  undefined4 uStack_470;
  undefined1 uStack_46c;
  fdb_config fStack_368;
  char acStack_270 [256];
  fdb_config *pfStack_170;
  fdb_doc *local_148;
  fdb_iterator *local_140;
  fdb_kvs_handle *local_138;
  fdb_file_handle *local_130;
  fdb_kvs_config local_128;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  local_148 = (fdb_doc *)0x0;
  memleak_start();
  pfVar2 = &local_100;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open(&local_130,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(local_130,&local_138,&local_128);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c091;
    fdb_set_kv(local_138,"a",1,(void *)0x0,0);
    pfVar2 = (fdb_config *)0x155b95;
    fdb_set_kv(local_138,"b",1,(void *)0x0,0);
    fdb_set_kv(local_138,"c",1,(void *)0x0,0);
    fVar1 = fdb_iterator_init(local_138,&local_140,"b",1,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c098;
    fVar1 = fdb_iterator_seek_to_min(local_140);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c09d;
    fVar1 = fdb_iterator_get(local_140,&local_148);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0a4;
    if (*local_148->key != 'b') goto LAB_0011c0ab;
    fdb_doc_free(local_148);
    local_148 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_seek_to_max(local_140);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0b3;
    fVar1 = fdb_iterator_get(local_140,&local_148);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0ba;
    if (*local_148->key != 'c') goto LAB_0011c0c1;
    fdb_doc_free(local_148);
    local_148 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_prev(local_140);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0c9;
    fVar1 = fdb_iterator_get(local_140,&local_148);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0d0;
    if (*local_148->key != 'b') goto LAB_0011c0d7;
    fdb_doc_free(local_148);
    local_148 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_next(local_140);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
    fVar1 = fdb_iterator_get(local_140,&local_148);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c0e6;
    if (*local_148->key == 'c') {
      fdb_doc_free(local_148);
      local_148 = (fdb_doc *)0x0;
      fdb_iterator_close(local_140);
      fdb_close(local_130);
      fdb_shutdown();
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar4,"iterator single doc range");
      return;
    }
  }
  else {
    iterator_uncommited_seeks();
LAB_0011c091:
    iterator_uncommited_seeks();
LAB_0011c098:
    iterator_uncommited_seeks();
LAB_0011c09d:
    iterator_uncommited_seeks();
LAB_0011c0a4:
    iterator_uncommited_seeks();
LAB_0011c0ab:
    iterator_uncommited_seeks();
LAB_0011c0b3:
    iterator_uncommited_seeks();
LAB_0011c0ba:
    iterator_uncommited_seeks();
LAB_0011c0c1:
    iterator_uncommited_seeks();
LAB_0011c0c9:
    iterator_uncommited_seeks();
LAB_0011c0d0:
    iterator_uncommited_seeks();
LAB_0011c0d7:
    iterator_uncommited_seeks();
LAB_0011c0df:
    iterator_uncommited_seeks();
LAB_0011c0e6:
    iterator_uncommited_seeks();
  }
  iterator_uncommited_seeks();
  pfStack_508 = (fdb_config *)0x11c10f;
  pfStack_170 = pfVar2;
  gettimeofday(&tStack_480,(__timezone_ptr_t)0x0);
  pfStack_508 = (fdb_config *)0x11c114;
  memleak_start();
  pfVar2 = &fStack_368;
  pfStack_508 = (fdb_config *)0x11c124;
  fdb_get_default_config();
  fStack_368.buffercache_size = 0;
  pfStack_508 = (fdb_config *)0x11c136;
  fdb_get_default_kvs_config();
  pfStack_508 = (fdb_config *)0x11c156;
  sprintf(acStack_270,"rm -rf  %s*","./iterator_test");
  pfStack_508 = (fdb_config *)0x11c15e;
  system(acStack_270);
  pfStack_508 = (fdb_config *)0x11c172;
  fVar1 = fdb_open(&pfStack_4e0,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_508 = (fdb_config *)0x11c190;
    fVar1 = fdb_kvs_open(pfStack_4e0,&pfStack_4e8,(char *)0x0,&fStack_498);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c32a;
    uStack_4a8 = 0x34323634353773;
    uStack_4a1 = 0xff;
    uStack_4c0 = 0x34323634353773;
    uStack_4b9 = 0x10000ff;
    uStack_4b0._0_4_ = 0x34353773;
    uStack_4b0._4_1_ = true;
    uStack_4b0._5_1_ = true;
    uStack_4b0._6_1_ = '4';
    uStack_4b0._7_1_ = 0xff;
    uStack_4d0 = 0xff34323634353773;
    uStack_4c8 = 0xff;
    uStack_470 = 0x3179656b;
    uStack_46c = 0;
    pfStack_508 = (fdb_config *)0x11c1f4;
    fVar1 = fdb_set_kv(pfStack_4e8,&uStack_4a8,0xb,&uStack_470,4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c32f;
    uStack_46c = 0;
    uStack_470 = 0x3279656b;
    pfStack_508 = (fdb_config *)0x11c228;
    fVar1 = fdb_set_kv(pfStack_4e8,&uStack_4c0,0xb,&uStack_470,4);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c334;
    pfStack_508 = (fdb_config *)0x11c23f;
    fVar1 = fdb_commit(pfStack_4e0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c339;
    pfStack_508 = (fdb_config *)0x11c272;
    fVar1 = fdb_iterator_init(pfStack_4e8,&pfStack_4f0,&uStack_4b0,8,&uStack_4d0,9,10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c33e;
    iVar3 = 0;
    pfVar2 = (fdb_config *)&pfStack_4d8;
    do {
      pfStack_4d8 = (fdb_doc *)0x0;
      pfStack_508 = (fdb_config *)0x11c297;
      fVar1 = fdb_iterator_get(pfStack_4f0,(fdb_doc **)pfVar2);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      iVar3 = iVar3 + 1;
      pfStack_508 = (fdb_config *)0x11c2a7;
      fdb_doc_free(pfStack_4d8);
      pfStack_508 = (fdb_config *)0x11c2b1;
      fVar1 = fdb_iterator_next(pfStack_4f0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    if (iVar3 != 2) goto LAB_0011c343;
    pfStack_508 = (fdb_config *)0x11c2c8;
    fVar1 = fdb_iterator_close(pfStack_4f0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c348;
    pfStack_508 = (fdb_config *)0x11c2d6;
    fVar1 = fdb_close(pfStack_4e0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c34d;
    pfStack_508 = (fdb_config *)0x11c2df;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_508 = (fdb_config *)0x11c2e8;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_508 = (fdb_config *)0x11c319;
      fprintf(_stderr,pcVar4,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_508 = (fdb_config *)0x11c32a;
    iterator_init_using_substring_test();
LAB_0011c32a:
    pfStack_508 = (fdb_config *)0x11c32f;
    iterator_init_using_substring_test();
LAB_0011c32f:
    pfStack_508 = (fdb_config *)0x11c334;
    iterator_init_using_substring_test();
LAB_0011c334:
    pfStack_508 = (fdb_config *)0x11c339;
    iterator_init_using_substring_test();
LAB_0011c339:
    pfStack_508 = (fdb_config *)0x11c33e;
    iterator_init_using_substring_test();
LAB_0011c33e:
    pfStack_508 = (fdb_config *)0x11c343;
    iterator_init_using_substring_test();
LAB_0011c343:
    pfStack_508 = (fdb_config *)0x11c348;
    iterator_init_using_substring_test();
LAB_0011c348:
    pfStack_508 = (fdb_config *)0x11c34d;
    iterator_init_using_substring_test();
LAB_0011c34d:
    pfStack_508 = (fdb_config *)0x11c352;
    iterator_init_using_substring_test();
  }
  pfStack_508 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_660 = (fdb_config *)0x11c36d;
  pfStack_508 = pfVar2;
  gettimeofday(&tStack_610,(__timezone_ptr_t)0x0);
  pfStack_660 = (fdb_config *)0x11c372;
  memleak_start();
  pfStack_648 = (fdb_iterator *)0x0;
  pfStack_638 = (fdb_doc *)0x0;
  pfVar2 = &fStack_600;
  pfStack_660 = (fdb_config *)0x11c389;
  fdb_get_default_config();
  pfStack_660 = (fdb_config *)0x11c393;
  fdb_get_default_kvs_config();
  pfStack_660 = (fdb_config *)0x11c39f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_660 = (fdb_config *)0x11c3b3;
  fVar1 = fdb_open(&pfStack_630,"./iterator_test1",pfVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_660 = (fdb_config *)0x11c3cf;
    fVar1 = fdb_kvs_open_default(pfStack_630,&pfStack_640,&fStack_628);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c58c;
    pfStack_660 = (fdb_config *)0x11c3f2;
    fdb_set_kv(pfStack_640,"A",1,(void *)0x0,0);
    pfVar2 = (fdb_config *)0x155dcc;
    pfStack_660 = (fdb_config *)0x11c410;
    fdb_set_kv(pfStack_640,"B",1,(void *)0x0,0);
    pfStack_660 = (fdb_config *)0x11c43b;
    fVar1 = fdb_iterator_init(pfStack_640,&pfStack_648,"B",1,"Bzz",3,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c593;
    pfStack_660 = (fdb_config *)0x11c44d;
    fVar1 = fdb_iterator_seek_to_max(pfStack_648);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c598;
    pfStack_660 = (fdb_config *)0x11c464;
    fVar1 = fdb_iterator_get(pfStack_648,&pfStack_638);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c59f;
    if (*pfStack_638->key != 'B') goto LAB_0011c5a6;
    pfStack_660 = (fdb_config *)0x11c483;
    fdb_doc_free(pfStack_638);
    pfStack_638 = (fdb_doc *)0x0;
    pfStack_660 = (fdb_config *)0x11c496;
    fVar1 = fdb_iterator_close(pfStack_648);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5ae;
    pfStack_648 = (fdb_iterator *)0x0;
    pfStack_660 = (fdb_config *)0x11c4bd;
    fVar1 = fdb_del_kv(pfStack_640,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5b5;
    pfStack_660 = (fdb_config *)0x11c4f4;
    fVar1 = fdb_iterator_init(pfStack_640,&pfStack_648,"B",1,"Bzz",3,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5bc;
    pfStack_660 = (fdb_config *)0x11c50b;
    fVar1 = fdb_iterator_get(pfStack_648,&pfStack_638);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c1;
    pfStack_660 = (fdb_config *)0x11c51e;
    fVar1 = fdb_iterator_seek_to_max(pfStack_648);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c5c6;
    pfStack_660 = (fdb_config *)0x11c531;
    fVar1 = fdb_close(pfStack_630);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c5cb;
    pfStack_660 = (fdb_config *)0x11c53e;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_660 = (fdb_config *)0x11c54b;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_660 = (fdb_config *)0x11c57c;
      fprintf(_stderr,pcVar4,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_660 = (fdb_config *)0x11c58c;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c58c:
    pfStack_660 = (fdb_config *)0x11c593;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c593:
    pfStack_660 = (fdb_config *)0x11c598;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c598:
    pfStack_660 = (fdb_config *)0x11c59f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c59f:
    pfStack_660 = (fdb_config *)0x11c5a6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5a6:
    pfStack_660 = (fdb_config *)0x11c5ae;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5ae:
    pfStack_660 = (fdb_config *)0x11c5b5;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5b5:
    pfStack_660 = (fdb_config *)0x11c5bc;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5bc:
    pfStack_660 = (fdb_config *)0x11c5c1;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c1:
    pfStack_660 = (fdb_config *)0x11c5c6;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5c6:
    pfStack_660 = (fdb_config *)0x11c5cb;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c5cb:
    pfStack_660 = (fdb_config *)0x11c5d2;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_660 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_660 = pfVar2;
  gettimeofday(&tStack_768,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_7a0 = (fdb_iterator *)0x0;
  pfStack_788 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open(&pfStack_790,"./iterator_test1",&fStack_758);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open_default(pfStack_790,&pfStack_798,&fStack_780);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c779;
    fdb_set_kv(pfStack_798,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_798,"C",1,(void *)0x0,0);
    fVar1 = fdb_del_kv(pfStack_798,"B",1);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c780;
    fVar1 = fdb_iterator_init(pfStack_798,&pfStack_7a0,"A",1,"B",1,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c787;
    fVar1 = fdb_iterator_get(pfStack_7a0,&pfStack_788);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c78c;
    fVar1 = fdb_iterator_seek_to_min(pfStack_7a0);
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c791;
    fVar1 = fdb_iterator_close(pfStack_7a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c796;
    fVar1 = fdb_close(pfStack_790);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar4 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar4 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar4,"iterator seek to min test");
        return;
      }
      goto LAB_0011c7a4;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c779:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c780:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c787:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c78c:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c791:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c796:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c7a4:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar3 = 0;
  do {
    delete_opt = 0;
    do {
      iterator_complete_test(iVar3,delete_opt);
      delete_opt = delete_opt + 1;
    } while (delete_opt == 1);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void iterator_uncommited_seeks()
{
    TEST_INIT();

    int r;

    fdb_status status;
    fdb_kvs_handle *db;
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_doc *rdoc;
    rdoc=NULL;

    memleak_start();

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;
    TEST_STATUS(fdb_open(&dbfile, "./iterator_test1", &fconfig));
    TEST_STATUS(fdb_kvs_open_default(dbfile, &db, &kvs_config));

    fdb_set_kv(db, "a", 1, NULL, 0);
    fdb_set_kv(db, "b", 1, NULL, 0);
    fdb_set_kv(db, "c", 1, NULL, 0);

    status = fdb_iterator_init(db, &it, "b", 1, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'b'
    status = fdb_iterator_seek_to_min(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "b", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'c'
    status = fdb_iterator_seek_to_max(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "c", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'b'
    status = fdb_iterator_prev(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "b", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'c'
    status = fdb_iterator_next(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "c", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("iterator single doc range");
}